

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

bool __thiscall internalJSONNode::IsEqualTo(internalJSONNode *this,internalJSONNode *val)

{
  JSONNode *pJVar1;
  JSONNode **ppJVar2;
  uchar uVar3;
  uchar uVar4;
  bool bVar5;
  json_index_t jVar6;
  json_index_t jVar7;
  json_string *pjVar8;
  JSONNode **ppJVar9;
  bool local_a9;
  allocator local_91;
  json_string local_90;
  JSONNode **local_70;
  JSONNode **myrunner_end;
  JSONNode **myrunner;
  JSONNode **valrunner;
  allocator local_41;
  json_string local_40;
  internalJSONNode *local_20;
  internalJSONNode *val_local;
  internalJSONNode *this_local;
  
  if (this == val) {
    this_local._7_1_ = true;
  }
  else {
    local_20 = val;
    val_local = this;
    uVar3 = type(this);
    uVar4 = type(local_20);
    if (uVar3 == uVar4) {
      bVar5 = std::operator!=(&this->_name,&local_20->_name);
      if (bVar5) {
        this_local._7_1_ = false;
      }
      else {
        uVar3 = type(this);
        if (uVar3 == '\0') {
          this_local._7_1_ = true;
        }
        else {
          Fetch(this);
          Fetch(local_20);
          uVar3 = type(this);
          if (uVar3 == '\x01') {
            this_local._7_1_ = std::operator==(&local_20->_string,&this->_string);
          }
          else if (uVar3 == '\x02') {
            this_local._7_1_ = _floatsAreEqual(&(local_20->_value)._number,&(this->_value)._number);
          }
          else if (uVar3 == '\x03') {
            this_local._7_1_ = ((local_20->_value)._bool & 1U) == ((this->_value)._bool & 1U);
          }
          else {
            uVar3 = type(this);
            local_a9 = true;
            if (uVar3 != '\x05') {
              uVar3 = type(this);
              local_a9 = uVar3 == '\x04';
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_40,"Checking for equality, not sure what type",&local_41);
            JSONDebug::_JSON_ASSERT(local_a9,&local_40);
            std::__cxx11::string::~string((string *)&local_40);
            std::allocator<char>::~allocator((allocator<char> *)&local_41);
            jVar6 = jsonChildren::size(this->Children);
            jVar7 = jsonChildren::size(local_20->Children);
            if (jVar6 == jVar7) {
              myrunner = jsonChildren::begin(local_20->Children);
              myrunner_end = jsonChildren::begin(this->Children);
              local_70 = jsonChildren::end(this->Children);
              for (; myrunner_end != local_70; myrunner_end = myrunner_end + 1) {
                pJVar1 = *myrunner_end;
                pjVar8 = jsonSingletonERROR_NULL_IN_CHILDREN::getValue_abi_cxx11_();
                JSONDebug::_JSON_ASSERT(pJVar1 != (JSONNode *)0x0,pjVar8);
                pJVar1 = *myrunner;
                pjVar8 = jsonSingletonERROR_NULL_IN_CHILDREN::getValue_abi_cxx11_();
                JSONDebug::_JSON_ASSERT(pJVar1 != (JSONNode *)0x0,pjVar8);
                ppJVar2 = myrunner;
                ppJVar9 = jsonChildren::end(local_20->Children);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_90,
                           "at the end of other one\'s children, but they\'re the same size?",
                           &local_91);
                JSONDebug::_JSON_ASSERT(ppJVar2 != ppJVar9,&local_90);
                std::__cxx11::string::~string((string *)&local_90);
                std::allocator<char>::~allocator((allocator<char> *)&local_91);
                bVar5 = ::JSONNode::operator!=(*myrunner_end,*myrunner);
                if (bVar5) {
                  return false;
                }
                myrunner = myrunner + 1;
              }
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool internalJSONNode::IsEqualTo(const internalJSONNode * val) const json_nothrow {
    if (this == val) return true;  //same internal object, so they must be equal (not only for ref counting)
    if (type() != val -> type()) return false;	 //aren't even same type
    if (_name != val -> _name) return false;  //names aren't the same
    if (type() == JSON_NULL) return true;  //both null, can't be different
    #if !defined(JSON_PREPARSE) && defined(JSON_READ_PRIORITY) 
	   Fetch();
	   val -> Fetch();
    #endif 
    switch (type()){
	   case JSON_STRING:
		  return val -> _string == _string;
	   case JSON_NUMBER:
		  return _floatsAreEqual(val -> _value._number, _value._number);
	   case JSON_BOOL:
		  return val -> _value._bool == _value._bool;
    };

    JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, JSON_TEXT("Checking for equality, not sure what type"));
    if (CHILDREN -> size() != val -> CHILDREN -> size()) return false;  //if they arne't he same size then they certainly aren't equal

    //make sure each children is the same
    JSONNode ** valrunner = val -> CHILDREN -> begin();
    json_foreach(CHILDREN, myrunner){
        JSON_ASSERT(*myrunner != NULL, json_global(ERROR_NULL_IN_CHILDREN));
		JSON_ASSERT(*valrunner != NULL, json_global(ERROR_NULL_IN_CHILDREN));
		JSON_ASSERT(valrunner != val -> CHILDREN -> end(), JSON_TEXT("at the end of other one's children, but they're the same size?"));
        if (**myrunner != **valrunner) return false;
		++valrunner;
    }
    return true;
}